

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::MergeMeshes
               (aiMesh **_out,uint param_2,const_iterator begin,const_iterator end)

{
  aiFace *paVar1;
  bool bVar2;
  aiMesh *paVar3;
  aiVector3D *paVar4;
  Logger *pLVar5;
  aiVector3D *__s;
  aiColor4D *__s_00;
  ulong *puVar6;
  aiFace *paVar7;
  uint uVar8;
  int iVar9;
  aiFace *paVar10;
  const_iterator cVar11;
  const_iterator it_3;
  aiMesh *paVar12;
  uint q;
  ulong uVar13;
  const_iterator it_6;
  ulong uVar14;
  const_iterator it;
  long lVar15;
  allocator local_71;
  string name;
  string local_50 [32];
  
  if (_out != (aiMesh **)0x0) {
    if (begin._M_current == end._M_current) {
      *_out = (aiMesh *)0x0;
    }
    else {
      paVar3 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar3);
      *_out = paVar3;
      paVar3->mMaterialIndex = (*begin._M_current)->mMaterialIndex;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
          cVar11._M_current = cVar11._M_current + 1) {
        std::__cxx11::string::string(local_50,((*cVar11._M_current)->mName).data,&local_71);
        std::__cxx11::string::append((string *)&name);
        std::__cxx11::string::~string(local_50);
        if (cVar11._M_current != end._M_current + -1) {
          std::__cxx11::string::append((char *)&name);
        }
        paVar12 = *cVar11._M_current;
        paVar3->mNumVertices = paVar3->mNumVertices + paVar12->mNumVertices;
        paVar3->mNumFaces = paVar3->mNumFaces + paVar12->mNumFaces;
        paVar3->mNumBones = paVar3->mNumBones + paVar12->mNumBones;
        paVar3->mPrimitiveTypes = paVar3->mPrimitiveTypes | paVar12->mPrimitiveTypes;
      }
      aiString::Set(&paVar3->mName,name._M_dataplus._M_p);
      if ((ulong)paVar3->mNumVertices != 0) {
        paVar12 = *begin._M_current;
        uVar8 = paVar12->mNumVertices;
        if (uVar8 != 0 && paVar12->mVertices != (aiVector3D *)0x0) {
          uVar14 = (ulong)paVar3->mNumVertices * 0xc;
          paVar4 = (aiVector3D *)operator_new__(uVar14);
          uVar14 = uVar14 - 0xc;
          memset(paVar4,0,(uVar14 - uVar14 % 0xc) + 0xc);
          paVar3->mVertices = paVar4;
          for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
              cVar11._M_current = cVar11._M_current + 1) {
            paVar12 = *cVar11._M_current;
            if (paVar12->mVertices == (aiVector3D *)0x0) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,
                           "JoinMeshes: Positions expected but input mesh contains no positions");
              paVar12 = *cVar11._M_current;
            }
            else {
              memcpy(paVar4,paVar12->mVertices,(ulong)paVar12->mNumVertices * 0xc);
            }
            paVar4 = paVar4 + paVar12->mNumVertices;
          }
          paVar12 = *begin._M_current;
          uVar8 = paVar12->mNumVertices;
        }
        if ((paVar12->mNormals != (aiVector3D *)0x0) && (uVar8 != 0)) {
          uVar8 = paVar3->mNumVertices;
          uVar14 = (ulong)uVar8 * 0xc;
          paVar4 = (aiVector3D *)operator_new__(uVar14);
          if (uVar8 != 0) {
            uVar14 = uVar14 - 0xc;
            memset(paVar4,0,(uVar14 - uVar14 % 0xc) + 0xc);
          }
          paVar3->mNormals = paVar4;
          for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
              cVar11._M_current = cVar11._M_current + 1) {
            paVar12 = *cVar11._M_current;
            if (paVar12->mNormals == (aiVector3D *)0x0) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,"JoinMeshes: Normals expected but input mesh contains no normals")
              ;
              paVar12 = *cVar11._M_current;
            }
            else {
              memcpy(paVar4,paVar12->mNormals,(ulong)paVar12->mNumVertices * 0xc);
            }
            paVar4 = paVar4 + paVar12->mNumVertices;
          }
          paVar12 = *begin._M_current;
        }
        bVar2 = aiMesh::HasTangentsAndBitangents(paVar12);
        if (bVar2) {
          uVar8 = paVar3->mNumVertices;
          uVar14 = (ulong)uVar8 * 0xc;
          paVar4 = (aiVector3D *)operator_new__(uVar14);
          if (uVar8 != 0) {
            memset(paVar4,0,((uVar14 - 0xc) - (uVar14 - 0xc) % 0xc) + 0xc);
          }
          paVar3->mTangents = paVar4;
          __s = (aiVector3D *)operator_new__(uVar14);
          if (uVar8 != 0) {
            memset(__s,0,((uVar14 - 0xc) - (uVar14 - 0xc) % 0xc) + 0xc);
          }
          paVar3->mBitangents = __s;
          for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
              cVar11._M_current = cVar11._M_current + 1) {
            paVar12 = *cVar11._M_current;
            if (paVar12->mTangents == (aiVector3D *)0x0) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,
                           "JoinMeshes: Tangents expected but input mesh contains no tangents");
              paVar12 = *cVar11._M_current;
            }
            else {
              memcpy(paVar4,paVar12->mTangents,(ulong)paVar12->mNumVertices * 0xc);
              memcpy(__s,paVar12->mBitangents,(ulong)paVar12->mNumVertices * 0xc);
            }
            paVar4 = paVar4 + paVar12->mNumVertices;
            __s = __s + paVar12->mNumVertices;
          }
        }
        lVar15 = 0;
        while (((lVar15 != 8 &&
                (paVar12 = *begin._M_current, paVar12->mTextureCoords[lVar15] != (aiVector3D *)0x0))
               && (paVar12->mNumVertices != 0))) {
          paVar3->mNumUVComponents[lVar15] = paVar12->mNumUVComponents[lVar15];
          uVar8 = paVar3->mNumVertices;
          uVar14 = (ulong)uVar8 * 0xc;
          paVar4 = (aiVector3D *)operator_new__(uVar14);
          if (uVar8 != 0) {
            uVar14 = uVar14 - 0xc;
            memset(paVar4,0,(uVar14 - uVar14 % 0xc) + 0xc);
          }
          paVar3->mTextureCoords[lVar15] = paVar4;
          for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
              cVar11._M_current = cVar11._M_current + 1) {
            paVar12 = *cVar11._M_current;
            if (paVar12->mTextureCoords[lVar15] == (aiVector3D *)0x0) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,"JoinMeshes: UVs expected but input mesh contains no UVs");
              paVar12 = *cVar11._M_current;
            }
            else {
              memcpy(paVar4,paVar12->mTextureCoords[lVar15],(ulong)paVar12->mNumVertices * 0xc);
            }
            paVar4 = paVar4 + paVar12->mNumVertices;
          }
          lVar15 = lVar15 + 1;
        }
        lVar15 = 0;
        while (((lVar15 != 8 && ((*begin._M_current)->mColors[lVar15] != (aiColor4D *)0x0)) &&
               ((*begin._M_current)->mNumVertices != 0))) {
          uVar8 = paVar3->mNumVertices;
          uVar14 = (ulong)uVar8 << 4;
          __s_00 = (aiColor4D *)operator_new__(uVar14);
          if (uVar8 != 0) {
            memset(__s_00,0,uVar14);
          }
          paVar3->mColors[lVar15] = __s_00;
          for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
              cVar11._M_current = cVar11._M_current + 1) {
            paVar12 = *cVar11._M_current;
            if (paVar12->mColors[lVar15] == (aiColor4D *)0x0) {
              pLVar5 = DefaultLogger::get();
              Logger::warn(pLVar5,"JoinMeshes: VCs expected but input mesh contains no VCs");
              paVar12 = *cVar11._M_current;
            }
            else {
              memcpy(__s_00,paVar12->mColors[lVar15],(ulong)paVar12->mNumVertices << 4);
            }
            __s_00 = __s_00 + paVar12->mNumVertices;
          }
          lVar15 = lVar15 + 1;
        }
      }
      uVar14 = (ulong)paVar3->mNumFaces;
      if (uVar14 != 0) {
        puVar6 = (ulong *)operator_new__(uVar14 * 0x10 + 8);
        *puVar6 = uVar14;
        paVar7 = (aiFace *)(puVar6 + 1);
        paVar10 = paVar7;
        do {
          paVar10->mNumIndices = 0;
          paVar10->mIndices = (uint *)0x0;
          paVar10 = paVar10 + 1;
        } while (paVar10 != (aiFace *)(puVar6 + uVar14 * 2 + 1));
        paVar3->mFaces = paVar7;
        iVar9 = 0;
        for (cVar11._M_current = begin._M_current; cVar11._M_current != end._M_current;
            cVar11._M_current = cVar11._M_current + 1) {
          for (uVar14 = 0; paVar12 = *cVar11._M_current, uVar14 < paVar12->mNumFaces;
              uVar14 = uVar14 + 1) {
            paVar1 = paVar12->mFaces;
            paVar10 = paVar1 + uVar14;
            paVar7->mNumIndices = paVar1[uVar14].mNumIndices;
            paVar7->mIndices = paVar1[uVar14].mIndices;
            if (iVar9 != 0) {
              for (uVar13 = 0; uVar13 < paVar10->mNumIndices; uVar13 = uVar13 + 1) {
                paVar10->mIndices[uVar13] = paVar10->mIndices[uVar13] + iVar9;
              }
            }
            paVar10->mIndices = (uint *)0x0;
            paVar7 = paVar7 + 1;
          }
          iVar9 = iVar9 + paVar12->mNumVertices;
        }
      }
      if (paVar3->mNumBones != 0) {
        MergeBones(paVar3,begin,end);
      }
      for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
        paVar3 = *begin._M_current;
        if (paVar3 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar3);
        }
        operator_delete(paVar3);
      }
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMeshes(aiMesh** _out, unsigned int /*flags*/,
    std::vector<aiMesh*>::const_iterator begin,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == _out ) {
        return;
    }

    if (begin == end)   {
        *_out = NULL; // no meshes ...
        return;
    }

    // Allocate the output mesh
    aiMesh* out = *_out = new aiMesh();
    out->mMaterialIndex = (*begin)->mMaterialIndex;

    std::string name;
    // Find out how much output storage we'll need
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it) {
        const char *meshName( (*it)->mName.C_Str() );
        name += std::string( meshName );
        if ( it != end - 1 ) {
            name += ".";
        }
        out->mNumVertices   += (*it)->mNumVertices;
        out->mNumFaces      += (*it)->mNumFaces;
        out->mNumBones      += (*it)->mNumBones;

        // combine primitive type flags
        out->mPrimitiveTypes |= (*it)->mPrimitiveTypes;
    }
    out->mName.Set( name.c_str() );

    if (out->mNumVertices) {
        aiVector3D* pv2;

        // copy vertex positions
        if ((**begin).HasPositions())   {

            pv2 = out->mVertices = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it)  {
                if ((*it)->mVertices)   {
                    ::memcpy(pv2,(*it)->mVertices,(*it)->mNumVertices*sizeof(aiVector3D));
                }
                else ASSIMP_LOG_WARN("JoinMeshes: Positions expected but input mesh contains no positions");
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy normals
        if ((**begin).HasNormals()) {

            pv2 = out->mNormals = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mNormals)    {
                    ::memcpy(pv2,(*it)->mNormals,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Normals expected but input mesh contains no normals" );
                }
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy tangents and bi-tangents
        if ((**begin).HasTangentsAndBitangents())   {

            pv2 = out->mTangents = new aiVector3D[out->mNumVertices];
            aiVector3D* pv2b = out->mBitangents = new aiVector3D[out->mNumVertices];

            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it) {
                if ((*it)->mTangents)   {
                    ::memcpy(pv2, (*it)->mTangents,  (*it)->mNumVertices*sizeof(aiVector3D));
                    ::memcpy(pv2b,(*it)->mBitangents,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Tangents expected but input mesh contains no tangents" );
                }
                pv2  += (*it)->mNumVertices;
                pv2b += (*it)->mNumVertices;
            }
        }
        // copy texture coordinates
        unsigned int n = 0;
        while ((**begin).HasTextureCoords(n)) {
            out->mNumUVComponents[n] = (*begin)->mNumUVComponents[n];

            pv2 = out->mTextureCoords[n] = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mTextureCoords[n])   {
                    ::memcpy(pv2,(*it)->mTextureCoords[n],(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: UVs expected but input mesh contains no UVs" );
                }
                pv2 += (*it)->mNumVertices;
            }
            ++n;
        }
        // copy vertex colors
        n = 0;
        while ((**begin).HasVertexColors(n))    {
            aiColor4D *pVec2 = out->mColors[n] = new aiColor4D[out->mNumVertices];
            for ( std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it )   {
                if ((*it)->mColors[n])  {
                    ::memcpy( pVec2, (*it)->mColors[ n ], (*it)->mNumVertices * sizeof( aiColor4D ) ) ;
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: VCs expected but input mesh contains no VCs" );
                }
                pVec2 += (*it)->mNumVertices;
            }
            ++n;
        }
    }

    if (out->mNumFaces) // just for safety
    {
        // copy faces
        out->mFaces = new aiFace[out->mNumFaces];
        aiFace* pf2 = out->mFaces;

        unsigned int ofs = 0;
        for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
            for (unsigned int m = 0; m < (*it)->mNumFaces;++m,++pf2)    {
                aiFace& face = (*it)->mFaces[m];
                pf2->mNumIndices = face.mNumIndices;
                pf2->mIndices = face.mIndices;

                if (ofs)    {
                    // add the offset to the vertex
                    for (unsigned int q = 0; q < face.mNumIndices; ++q)
                        face.mIndices[q] += ofs;
                }
                face.mIndices = NULL;
            }
            ofs += (*it)->mNumVertices;
        }
    }

    // bones - as this is quite lengthy, I moved the code to a separate function
    if (out->mNumBones)
        MergeBones(out,begin,end);

    // delete all source meshes
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)
        delete *it;
}